

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O1

void __thiscall
density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::discard_page_stack
          (PageAllocator<density::detail::SystemPageManager<65536UL>_> *this,
          page_allocation_type i_allocation_type,PageStack *i_page_stack)

{
  PageAllocatorSlot *pPVar1;
  PageAllocatorSlot *pPVar2;
  bool bVar3;
  
  if (i_page_stack->m_first == (PageFooter *)0x0) {
    density_tests::detail::assert_failed<>
              ("!i_page_stack.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/page_allocator.h"
               ,0x19d);
  }
  pPVar1 = this->m_current_slot;
  do {
    bVar3 = WF_PageStack::try_push
                      (&this->m_current_slot->m_page_stack + (i_allocation_type != uninitialized),
                       i_page_stack);
    if (bVar3) {
      return;
    }
    pPVar2 = (this->m_current_slot->m_next_slot)._M_b._M_p;
    this->m_current_slot = pPVar2;
  } while (pPVar1 != pPVar2);
  if (bVar3) {
    return;
  }
  PageStack::push(&this->m_private_page_stack + (i_allocation_type != uninitialized),i_page_stack);
  return;
}

Assistant:

void discard_page_stack(
              page_allocation_type const i_allocation_type, PageStack & i_page_stack) noexcept
            {
                DENSITY_ASSERT_INTERNAL(!i_page_stack.empty());

                // try to push the page once on every slot
                auto * const original_slot = m_current_slot;
                bool         done          = false;
                do
                {

                    if (m_current_slot->get_stack(i_allocation_type).try_push(i_page_stack))
                    {
                        done = true;
                        break;
                    }

                    m_current_slot = m_current_slot->m_next_slot.load();
                } while (m_current_slot != original_slot);

                // this is unlikely, but it may happen
                if (!done)
                {
                    get_private_stack(i_allocation_type).push(i_page_stack);
                }
            }